

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void f_parser(lua_State *L,void *ud)

{
  size_t sVar1;
  int iVar2;
  ZIO *z;
  char *__s;
  byte *pbVar3;
  global_State *pgVar4;
  size_t l;
  void *pvVar5;
  GCObject *pGVar6;
  GCObject *pGVar7;
  StkId pTVar8;
  int newsize;
  ulong uVar9;
  LexState lexstate;
  LexState local_2d8;
  FuncState local_278;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  z = *ud;
  __s = *(char **)((long)ud + 0x20);
  local_2d8.buff = (Mbuffer *)((long)ud + 8);
  l = strlen(__s);
  local_2d8.source = luaS_newlstr(L,__s,l);
  local_2d8.decpoint = '.';
  local_2d8.lookahead.token = 0x11f;
  local_2d8.fs = (FuncState *)0x0;
  local_2d8.linenumber = 1;
  local_2d8.lastline = 1;
  local_2d8.L = L;
  local_2d8.z = z;
  pvVar5 = luaM_realloc_(L,*(void **)((long)ud + 8),*(size_t *)((long)ud + 0x18),0x20);
  *(void **)((long)ud + 8) = pvVar5;
  *(undefined8 *)((long)ud + 0x18) = 0x20;
  sVar1 = z->n;
  z->n = z->n - 1;
  if (sVar1 == 0) {
    local_2d8.current = luaZ_fill(z);
  }
  else {
    pbVar3 = (byte *)z->p;
    z->p = (char *)(pbVar3 + 1);
    local_2d8.current = (int)*pbVar3;
  }
  open_func(&local_2d8,&local_278);
  *(lu_byte *)((long)&(local_278.f)->nups + 2) = '\x02';
  local_2d8.lastline = local_2d8.linenumber;
  if (local_2d8.lookahead.token == 0x11f) {
    local_2d8.t.token = llex(&local_2d8,&local_2d8.t.seminfo);
  }
  else {
    local_2d8.t._4_4_ = local_2d8.lookahead._4_4_;
    local_2d8.t.token = local_2d8.lookahead.token;
    local_2d8.t.seminfo = local_2d8.lookahead.seminfo;
    local_2d8.lookahead.token = 0x11f;
  }
  chunk(&local_2d8);
  if (local_2d8.t.token == 0x11f) {
    close_func(&local_2d8);
    pGVar6 = (GCObject *)
             luaF_newLclosure(L,(uint)(byte)*(lu_mem *)&(local_278.f)->nups,&((L->l_gt).value.gc)->h
                             );
    (pGVar6->th).l_G = (global_State *)local_278.f;
    if ((lu_byte)*(lu_mem *)&(local_278.f)->nups != '\0') {
      uVar9 = 0;
      do {
        pGVar7 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x28);
        pgVar4 = L->l_G;
        (pGVar7->gch).next = pgVar4->rootgc;
        pgVar4->rootgc = pGVar7;
        (pGVar7->gch).marked = pgVar4->currentwhite & 3;
        (pGVar7->gch).tt = '\n';
        (pGVar7->h).metatable = (Table *)&(pGVar7->h).array;
        *(undefined4 *)&(pGVar7->h).node = 0;
        *(GCObject **)((long)pGVar6 + uVar9 * 8 + 0x28) = pGVar7;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (byte)*(lu_mem *)&(local_278.f)->nups);
    }
    pTVar8 = L->top;
    (pTVar8->value).gc = pGVar6;
    pTVar8->tt = 6;
    pTVar8 = L->top;
    if ((long)L->stack_last - (long)pTVar8 < 0x11) {
      iVar2 = L->stacksize;
      newsize = iVar2 * 2;
      if (iVar2 < 1) {
        newsize = iVar2 + 1;
      }
      luaD_reallocstack(L,newsize);
      pTVar8 = L->top;
    }
    L->top = pTVar8 + 1;
    return;
  }
  error_expected(&local_2d8,0x11f);
}

Assistant:

static void f_parser(lua_State*L,void*ud){
int i;
Proto*tf;
Closure*cl;
struct SParser*p=cast(struct SParser*,ud);
luaC_checkGC(L);
tf=luaY_parser(L,p->z,
&p->buff,p->name);
cl=luaF_newLclosure(L,tf->nups,hvalue(gt(L)));
cl->l.p=tf;
for(i=0;i<tf->nups;i++)
cl->l.upvals[i]=luaF_newupval(L);
setclvalue(L,L->top,cl);
incr_top(L);
}